

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O2

uint32_t helper_maddr_q(CPUTriCoreState *env,uint32_t r1,uint32_t r2,uint32_t r3,uint32_t n)

{
  byte *pbVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  lVar6 = 0x7fffffff;
  if (n != 1 || (r3 != 0xffff8000 || r2 != 0xffff8000)) {
    lVar6 = (long)(int)r3 * (long)(int)r2 << ((byte)n & 0x3f);
  }
  iVar4 = (int)lVar6 + r1;
  uVar2 = 0;
  if ((lVar6 + (int)r1) - 0x7fff8000U < 0xffffffff00000000) {
    pbVar1 = (byte *)((long)&env->PSW_USB_SV + 3);
    *pbVar1 = *pbVar1 | 0x80;
    uVar2 = 0x80000000;
  }
  env->PSW_USB_V = uVar2;
  uVar3 = iVar4 + 0x8000;
  uVar5 = iVar4 * 2 + 0x10000U ^ uVar3;
  env->PSW_USB_AV = uVar5;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar5;
  return uVar3 & 0xffff0000;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}